

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vbpermd_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  uint64_t uVar1;
  uint64_t uStack_38;
  int index;
  ppc_avr_t result;
  int j;
  int i;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  _j = b;
  b_local = a;
  a_local = r;
  memset(&stack0xffffffffffffffc8,0,0x10);
  for (result.u32[3] = 1; -1 < result.s32[3]; result.u32[3] = result.u32[3] - 1) {
    for (result.u32[2] = 0; result.s32[2] < 8; result.u32[2] = result.u32[2] + 1) {
      if (_j->u8[(int)(0xf - (result.u32[3] * 8 + result.u32[2]))] < 0x40) {
        uVar1 = extract64(b_local->u64[1 - result._12_4_],
                          0x3f - (uint)_j->u8[(int)(0xf - (result.u32[3] * 8 + result.u32[2]))],1);
        if (uVar1 != 0) {
          *(ulong *)((long)&stack0xffffffffffffffc8 + (long)(1 - result._12_4_) * 8) =
               (long)(0x80 >> ((byte)result.u32[2] & 0x1f)) |
               *(ulong *)((long)&stack0xffffffffffffffc8 + (long)(1 - result._12_4_) * 8);
        }
      }
    }
  }
  a_local->u64[0] = uStack_38;
  a_local->u64[1] = result.u64[0];
  return;
}

Assistant:

void helper_vbpermd(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i, j;
    ppc_avr_t result = { .u64 = { 0, 0 } };
    VECTOR_FOR_INORDER_I(i, u64) {
        for (j = 0; j < 8; j++) {
            int index = VBPERMQ_INDEX(b, (i * 8) + j);
            if (index < 64 && EXTRACT_BIT(a, i, index)) {
                result.u64[VBPERMD_INDEX(i)] |= (0x80 >> j);
            }
        }
    }
    *r = result;
}